

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O1

void __thiscall
libtorrent::aux::piece_picker::mark_as_canceled
          (piece_picker *this,piece_block block,torrent_peer *peer)

{
  int iVar1;
  pointer pbVar2;
  download_queue_t queue;
  iterator iVar3;
  long lVar4;
  uint uVar5;
  int iVar6;
  
  uVar5 = *(uint *)((this->m_piece_map).
                    super_vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    .
                    super__Vector_base<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>
                    ._M_impl.super__Vector_impl_data._M_start + block.piece_index.m_val.m_val);
  queue.m_val = (byte)(uVar5 >> 0x1a) & 7;
  if (queue.m_val != 4) {
    uVar5 = uVar5 >> 0x1a & 7;
    if (uVar5 == 5) {
      queue.m_val = '\0';
    }
    else if (uVar5 == 6) {
      queue.m_val = '\x01';
    }
    iVar3 = find_dl_piece(this,queue,block.piece_index.m_val);
    iVar1 = this->m_piece_size;
    iVar6 = 0x4000;
    if (iVar1 < 0x4000) {
      iVar6 = iVar1;
    }
    lVar4 = (long)((iVar1 + iVar6 + -1) / iVar6) * (ulong)(iVar3._M_current)->info_idx;
    pbVar2 = (this->m_block_info).
             super_vector<libtorrent::aux::piece_picker::block_info,_std::allocator<libtorrent::aux::piece_picker::block_info>_>
             .
             super__Vector_base<libtorrent::aux::piece_picker::block_info,_std::allocator<libtorrent::aux::piece_picker::block_info>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(ushort *)&pbVar2[lVar4 + ((long)block >> 0x20)].field_0x8 < 0xc000) {
      pbVar2[lVar4 + ((long)block >> 0x20)].peer = peer;
    }
  }
  return;
}

Assistant:

void piece_picker::mark_as_canceled(piece_block const block, aux::torrent_peer* peer)
	{
#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "mark_as_cancelled( {"
			<< block.piece_index << ", " << block.block_index
			<< "} )" << std::endl;
#endif

#if TORRENT_USE_INVARIANT_CHECKS
		check_piece_state();
#endif
		TORRENT_ASSERT(block.block_index >= 0);
		piece_pos& p = m_piece_map[block.piece_index];

		if (p.download_queue() == piece_pos::piece_open) return;

		auto i = find_dl_piece(p.download_queue(), block.piece_index);

		TORRENT_ASSERT(i != m_downloads[p.download_queue()].end());
		auto const binfo = mutable_blocks_for_piece(*i);
		block_info& info = binfo[block.block_index];

		if (info.state == block_info::state_finished) return;

		TORRENT_ASSERT(info.num_peers == 0);
		info.peer = peer;
		TORRENT_ASSERT(info.state == block_info::state_writing
			|| peer == nullptr);
		if (info.state == block_info::state_writing)
		{
			--i->writing;
			info.state = block_info::state_none;
			// i may be invalid after this call
			i = update_piece_state(i);

			if (i->finished + i->writing + i->requested + i->hashing == 0)
			{
				int const prev_priority = p.priority(this);
				erase_download_piece(i);
				int const new_priority = p.priority(this);

				if (m_dirty) return;
				if (new_priority == prev_priority) return;
				if (prev_priority == -1) add(block.piece_index);
				else update(prev_priority, p.index);
			}
		}
		else
		{
			TORRENT_ASSERT(info.state == block_info::state_none);
		}

#if TORRENT_USE_INVARIANT_CHECKS
		check_piece_state();
#endif
	}